

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space2.cpp
# Opt level: O0

int destroy_alien_proc(Am_Object *self)

{
  Am_Slot_Key AVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  Am_Value *pAVar14;
  ushort uVar15;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object alien;
  Am_Object owner;
  int alien_bottom;
  int alien_right;
  int alien_top;
  int alien_left;
  int bullet_right;
  int bullet_left;
  int bullet_bottom;
  int bullet_top;
  int y_off;
  Am_Value_List local_28 [4];
  int x_off;
  Am_Value_List aliens;
  Am_Object *self_local;
  
  uVar15 = (ushort)self;
  pAVar14 = (Am_Value *)Am_Object::Get(uVar15,0x69);
  bVar2 = Am_Value::operator_cast_to_bool(pAVar14);
  if (bVar2) {
    pAVar14 = (Am_Value *)Am_Object::Get(0xb2e8,0x82);
    Am_Value_List::Am_Value_List(local_28,pAVar14);
    pAVar14 = (Am_Value *)Am_Object::Get(0xb2e8,100);
    iVar4 = Am_Value::operator_cast_to_int(pAVar14);
    pAVar14 = (Am_Value *)Am_Object::Get(0xb2e8,0x65);
    iVar5 = Am_Value::operator_cast_to_int(pAVar14);
    pAVar14 = (Am_Value *)Am_Object::Get(uVar15,0x65);
    iVar6 = Am_Value::operator_cast_to_int(pAVar14);
    pAVar14 = (Am_Value *)Am_Object::Get(uVar15,0x67);
    iVar7 = Am_Value::operator_cast_to_int(pAVar14);
    pAVar14 = (Am_Value *)Am_Object::Get(uVar15,100);
    iVar8 = Am_Value::operator_cast_to_int(pAVar14);
    pAVar14 = (Am_Value *)Am_Object::Get(uVar15,0x66);
    iVar9 = Am_Value::operator_cast_to_int(pAVar14);
    Am_Object::Get_Owner(&alien,(Am_Slot_Flags)self);
    Am_Object::Am_Object(&local_70);
    Am_Value_List::Start();
    while (bVar3 = Am_Value_List::Last(), ((bVar3 ^ 0xff) & 1) != 0) {
      pAVar14 = (Am_Value *)Am_Value_List::Get();
      Am_Object::operator=(&local_70,pAVar14);
      Am_Object::Get((ushort)&local_70,0xb0);
      bVar3 = Am_Value::Valid();
      if ((bVar3 & 1) != 0) {
        pAVar14 = (Am_Value *)Am_Object::Get((ushort)&local_70,100);
        iVar10 = Am_Value::operator_cast_to_int(pAVar14);
        iVar10 = iVar10 + iVar4;
        pAVar14 = (Am_Value *)Am_Object::Get((ushort)&local_70,0x65);
        iVar11 = Am_Value::operator_cast_to_int(pAVar14);
        iVar11 = iVar11 + iVar5;
        pAVar14 = (Am_Value *)Am_Object::Get((ushort)&local_70,0x66);
        iVar12 = Am_Value::operator_cast_to_int(pAVar14);
        pAVar14 = (Am_Value *)Am_Object::Get((ushort)&local_70,0x67);
        iVar13 = Am_Value::operator_cast_to_int(pAVar14);
        if ((((iVar10 <= iVar8) && (iVar8 <= iVar10 + iVar12)) ||
            ((iVar10 <= iVar8 + iVar9 && (iVar8 + iVar9 <= iVar10 + iVar12)))) &&
           (((iVar6 <= iVar11 + iVar13 && (iVar11 <= iVar6)) ||
            ((iVar6 + iVar7 <= iVar11 + iVar13 && (iVar11 <= iVar6 + iVar7)))))) {
          Am_Object::Set((ushort)&local_70,0xb0,0);
          AVar1 = NUM_ALIENS;
          pAVar14 = (Am_Value *)Am_Object::Get(0xb2e8,(ulong)NUM_ALIENS);
          iVar4 = Am_Value::operator_cast_to_int(pAVar14);
          Am_Object::Set(0xb2e8,(uint)AVar1,(ulong)(iVar4 - 1));
          Am_Object::Am_Object(&local_78,self);
          blot_bullet(&local_78);
          Am_Object::~Am_Object(&local_78);
          self_local._4_4_ = 0;
          goto LAB_00105460;
        }
      }
      Am_Value_List::Next();
    }
    self_local._4_4_ = 1;
LAB_00105460:
    Am_Object::~Am_Object(&local_70);
    Am_Object::~Am_Object(&alien);
    Am_Value_List::~Am_Value_List(local_28);
  }
  else {
    self_local._4_4_ = 0;
  }
  return self_local._4_4_;
}

Assistant:

Am_Define_Formula(int, destroy_alien)
{
  //  if I'm invisible, I've already destroyed something.
  if (!(bool)self.Get(Am_VISIBLE))
    return 0;

  Am_Value_List aliens = Aliens.Get(Am_GRAPHICAL_PARTS);
  int x_off = Aliens.Get(Am_LEFT);
  int y_off = Aliens.Get(Am_TOP);
  int bullet_top =
      self.Get(Am_TOP); // The ONLY Get: don't want to re-eval too often
  int bullet_bottom = bullet_top + (int)self.Get(Am_HEIGHT);
  int bullet_left = self.Get(Am_LEFT);
  int bullet_right = bullet_left + (int)self.Get(Am_WIDTH);
  int alien_left, alien_top, alien_right, alien_bottom;
  Am_Object owner = self.Get_Owner();
  Am_Object alien;
  for (aliens.Start(); !aliens.Last(); aliens.Next()) {
    alien = aliens.Get();
    if (!alien.Get(Am_IMAGE).Valid())
      continue;
    alien_left = (int)alien.Get(Am_LEFT) + x_off;
    alien_top = (int)alien.Get(Am_TOP) + y_off;
    alien_right = alien_left + (int)alien.Get(Am_WIDTH);
    alien_bottom = alien_top + (int)alien.Get(Am_HEIGHT);
    // We hit if any of the corners of the bullet are inside the alien
    if (((bullet_left >= alien_left && bullet_left <= alien_right) ||
         (bullet_right >= alien_left && bullet_right <= alien_right)) &&
        ((bullet_top <= alien_bottom && bullet_top >= alien_top) ||
         (bullet_bottom <= alien_bottom && bullet_bottom >= alien_top))) {
      alien.Set(Am_IMAGE, 0L);
      Aliens.Set(NUM_ALIENS, (int)Aliens.Get(NUM_ALIENS) - 1);

      blot_bullet(self);
      return 0;
    }
  }
  return 1;
}